

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O0

void UnitTests::stream_any_details::output_range_or_type<char*>
               (ostream *s,char **t,false_type *param_3)

{
  true_type local_21;
  false_type *local_20;
  false_type *param_2_local;
  char **t_local;
  ostream *s_local;
  
  local_20 = param_3;
  param_2_local = (false_type *)t;
  t_local = (char **)s;
  output<char*>(s,t,&local_21);
  return;
}

Assistant:

void output_range_or_type(std::ostream& s, const T& t, const std::false_type& /*unused*/)
        {
            output(s, t, is_streamable<T>{});
        }